

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3FinishCoding(Parse *pParse)

{
  sqlite3 *psVar1;
  Returning *pRVar2;
  int *piVar3;
  Vdbe *pVVar4;
  TableLock *pTVar5;
  char *pcVar6;
  ExprList *pEVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  Vdbe *p;
  VdbeOp *pVVar11;
  Op *pOVar12;
  int iVar13;
  long lVar14;
  AutoincInfo *pAVar15;
  ExprList *pEL;
  uint p1;
  long lVar16;
  VTable *zP4;
  ExprList_item *pEVar17;
  
  if (pParse->nested != '\0') {
    return;
  }
  psVar1 = pParse->db;
  if (pParse->nErr != 0) {
    iVar10 = 7;
    if (psVar1->mallocFailed == '\0') {
      return;
    }
    goto LAB_00162772;
  }
  p = pParse->pVdbe;
  if (p == (Vdbe *)0x0) {
    iVar10 = 0x65;
    if ((psVar1->init).busy != '\0') goto LAB_00162772;
    p = sqlite3GetVdbe(pParse);
    if (p != (Vdbe *)0x0) goto LAB_001622f0;
    pParse->rc = 1;
    p = (Vdbe *)0x0;
  }
  else {
LAB_001622f0:
    if ((pParse->bReturning != '\0') && (pRVar2 = (pParse->u1).pReturning, pRVar2->nRetCol != 0)) {
      iVar13 = 0;
      sqlite3VdbeAddOp3(p,0x53,0,0,0);
      iVar8 = sqlite3VdbeAddOp3(p,0x24,pRVar2->iRetCur,0,0);
      iVar10 = pRVar2->iRetReg;
      if (0 < pRVar2->nRetCol) {
        iVar13 = 0;
        do {
          sqlite3VdbeAddOp3(p,0x5e,pRVar2->iRetCur,iVar13,iVar13 + iVar10);
          iVar13 = iVar13 + 1;
        } while (iVar13 < pRVar2->nRetCol);
      }
      sqlite3VdbeAddOp3(p,0x54,iVar10,iVar13,0);
      sqlite3VdbeAddOp3(p,0x27,pRVar2->iRetCur,iVar8 + 1,0);
      if (p->db->mallocFailed == '\0') {
        pOVar12 = p->aOp + iVar8;
      }
      else {
        pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar12->p2 = p->nOp;
    }
    sqlite3VdbeAddOp3(p,0x46,0,0,0);
    if (p->db->mallocFailed == '\0') {
      pOVar12 = p->aOp;
    }
    else {
      pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar12->p2 = p->nOp;
    lVar14 = 0;
    lVar16 = 0;
    do {
      p1 = (uint)lVar16;
      uVar9 = 1 << ((byte)lVar16 & 0x1f);
      if ((pParse->cookieMask >> (p1 & 0x1f) & 1) != 0) {
        p->btreeMask = p->btreeMask | uVar9;
        if ((lVar14 != 0x20) &&
           (*(char *)(*(long *)((long)&p->db->aDb->pBt + lVar14) + 0x11) != '\0')) {
          p->lockMask = p->lockMask | uVar9;
        }
        piVar3 = *(int **)((long)&psVar1->aDb->pSchema + lVar14);
        sqlite3VdbeAddOp4Int
                  (p,2,p1,(uint)((pParse->writeMask >> (p1 & 0x1f) & 1) != 0),*piVar3,piVar3[1]);
        if (((psVar1->init).busy == '\0') && (0 < (long)p->nOp)) {
          p->aOp[(long)p->nOp + -1].p5 = 1;
        }
      }
      lVar16 = lVar16 + 1;
      lVar14 = lVar14 + 0x20;
    } while (lVar16 < psVar1->nDb);
    if (0 < pParse->nVtabLock) {
      lVar14 = 0;
      do {
        for (zP4 = (pParse->apVtabLock[lVar14]->u).vtab.p; zP4 != (VTable *)0x0; zP4 = zP4->pNext) {
          if (zP4->db == psVar1) goto LAB_00162534;
        }
        zP4 = (VTable *)0x0;
LAB_00162534:
        iVar10 = sqlite3VdbeAddOp3(p,0xaa,0,0,0);
        sqlite3VdbeChangeP4(p,iVar10,(char *)zP4,-0xb);
        lVar14 = lVar14 + 1;
      } while (lVar14 < pParse->nVtabLock);
    }
    pParse->nVtabLock = 0;
    if ((pParse->nTableLock != 0) && (0 < pParse->nTableLock)) {
      pVVar4 = pParse->pVdbe;
      lVar16 = 0x10;
      lVar14 = 0;
      do {
        pTVar5 = pParse->aTableLock;
        pcVar6 = *(char **)((long)&pTVar5->iDb + lVar16);
        iVar10 = sqlite3VdbeAddOp3(pVVar4,0xa9,*(int *)((long)pTVar5 + lVar16 + -0x10),
                                   *(int *)((long)pTVar5 + lVar16 + -0xc),
                                   (uint)*(byte *)((long)pTVar5 + lVar16 + -8));
        sqlite3VdbeChangeP4(pVVar4,iVar10,pcVar6,-1);
        lVar14 = lVar14 + 1;
        lVar16 = lVar16 + 0x18;
      } while (lVar14 < pParse->nTableLock);
    }
    pAVar15 = pParse->pAinc;
    if (pAVar15 != (AutoincInfo *)0x0) {
      psVar1 = pParse->db;
      pVVar4 = pParse->pVdbe;
      do {
        iVar10 = pAVar15->regCtr;
        sqlite3OpenTable(pParse,0,pAVar15->iDb,(psVar1->aDb[pAVar15->iDb].pSchema)->pSeqTab,0x66);
        pcVar6 = pAVar15->pTab->zName;
        iVar8 = sqlite3VdbeAddOp3(pVVar4,0x76,0,iVar10 + -1,0);
        iVar13 = 0;
        sqlite3VdbeChangeP4(pVVar4,iVar8,pcVar6,0);
        pVVar11 = sqlite3VdbeAddOpList
                            (pVVar4,0xc,(VdbeOpList *)sqlite3AutoincrementBegin_autoInc,iVar13);
        if (pVVar11 == (VdbeOp *)0x0) break;
        pVVar11->p2 = iVar10;
        pVVar11->p3 = iVar10 + 2;
        pVVar11[2].p3 = iVar10;
        pVVar11[3].p1 = iVar10 + -1;
        pVVar11[3].p3 = iVar10;
        pVVar11[3].p5 = 0x10;
        pVVar11[4].p2 = iVar10 + 1;
        pVVar11[5].p3 = iVar10;
        pVVar11[6].p1 = iVar10;
        pVVar11[7].p2 = iVar10 + 2;
        pVVar11[7].p1 = iVar10;
        pVVar11[10].p2 = iVar10;
        if (pParse->nTab == 0) {
          pParse->nTab = 1;
        }
        pAVar15 = pAVar15->pNext;
      } while (pAVar15 != (AutoincInfo *)0x0);
    }
    pEVar7 = pParse->pConstExpr;
    if ((pEVar7 != (ExprList *)0x0) && (pParse->okConstFactor = '\0', 0 < pEVar7->nExpr)) {
      pEVar17 = pEVar7->a;
      lVar14 = 0;
      do {
        sqlite3ExprCode(pParse,pEVar17->pExpr,(pEVar17->u).iConstExprReg);
        lVar14 = lVar14 + 1;
        pEVar17 = pEVar17 + 1;
      } while (lVar14 < pEVar7->nExpr);
    }
    if (pParse->bReturning != '\0') {
      iVar10 = ((pParse->u1).pReturning)->nRetCol;
      if (iVar10 != 0) {
        sqlite3VdbeAddOp3(p,0x75,((pParse->u1).pReturning)->iRetCur,iVar10,0);
      }
    }
    sqlite3VdbeAddOp3(p,9,0,1,0);
  }
  iVar10 = 1;
  if (pParse->nErr == 0) {
    sqlite3VdbeMakeReady(p,pParse);
    iVar10 = 0x65;
  }
LAB_00162772:
  pParse->rc = iVar10;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FinishCoding(Parse *pParse){
  sqlite3 *db;
  Vdbe *v;
  int iDb, i;

  assert( pParse->pToplevel==0 );
  db = pParse->db;
  assert( db->pParse==pParse );
  if( pParse->nested ) return;
  if( pParse->nErr ){
    if( db->mallocFailed ) pParse->rc = SQLITE_NOMEM;
    return;
  }
  assert( db->mallocFailed==0 );

  /* Begin by generating some termination code at the end of the
  ** vdbe program
  */
  v = pParse->pVdbe;
  if( v==0 ){
    if( db->init.busy ){
      pParse->rc = SQLITE_DONE;
      return;
    }
    v = sqlite3GetVdbe(pParse);
    if( v==0 ) pParse->rc = SQLITE_ERROR;
  }
  assert( !pParse->isMultiWrite
       || sqlite3VdbeAssertMayAbort(v, pParse->mayAbort));
  if( v ){
    if( pParse->bReturning ){
      Returning *pReturning = pParse->u1.pReturning;
      int addrRewind;
      int reg;

      if( pReturning->nRetCol ){
        sqlite3VdbeAddOp0(v, OP_FkCheck);
        addrRewind =
           sqlite3VdbeAddOp1(v, OP_Rewind, pReturning->iRetCur);
        VdbeCoverage(v);
        reg = pReturning->iRetReg;
        for(i=0; i<pReturning->nRetCol; i++){
          sqlite3VdbeAddOp3(v, OP_Column, pReturning->iRetCur, i, reg+i);
        }
        sqlite3VdbeAddOp2(v, OP_ResultRow, reg, i);
        sqlite3VdbeAddOp2(v, OP_Next, pReturning->iRetCur, addrRewind+1);
        VdbeCoverage(v);
        sqlite3VdbeJumpHere(v, addrRewind);
      }
    }
    sqlite3VdbeAddOp0(v, OP_Halt);

    /* The cookie mask contains one bit for each database file open.
    ** (Bit 0 is for main, bit 1 is for temp, and so forth.)  Bits are
    ** set for each database that is used.  Generate code to start a
    ** transaction on each used database and to verify the schema cookie
    ** on each used database.
    */
    assert( pParse->nErr>0 || sqlite3VdbeGetOp(v, 0)->opcode==OP_Init );
    sqlite3VdbeJumpHere(v, 0);
    assert( db->nDb>0 );
    iDb = 0;
    do{
      Schema *pSchema;
      if( DbMaskTest(pParse->cookieMask, iDb)==0 ) continue;
      sqlite3VdbeUsesBtree(v, iDb);
      pSchema = db->aDb[iDb].pSchema;
      sqlite3VdbeAddOp4Int(v,
        OP_Transaction,                    /* Opcode */
        iDb,                               /* P1 */
        DbMaskTest(pParse->writeMask,iDb), /* P2 */
        pSchema->schema_cookie,            /* P3 */
        pSchema->iGeneration               /* P4 */
      );
      if( db->init.busy==0 ) sqlite3VdbeChangeP5(v, 1);
      VdbeComment((v,
            "usesStmtJournal=%d", pParse->mayAbort && pParse->isMultiWrite));
    }while( ++iDb<db->nDb );
#ifndef SQLITE_OMIT_VIRTUALTABLE
    for(i=0; i<pParse->nVtabLock; i++){
      char *vtab = (char *)sqlite3GetVTable(db, pParse->apVtabLock[i]);
      sqlite3VdbeAddOp4(v, OP_VBegin, 0, 0, 0, vtab, P4_VTAB);
    }
    pParse->nVtabLock = 0;
#endif

#ifndef SQLITE_OMIT_SHARED_CACHE
    /* Once all the cookies have been verified and transactions opened,
    ** obtain the required table-locks. This is a no-op unless the
    ** shared-cache feature is enabled.
    */
    if( pParse->nTableLock ) codeTableLocks(pParse);
#endif

    /* Initialize any AUTOINCREMENT data structures required.
    */
    if( pParse->pAinc ) sqlite3AutoincrementBegin(pParse);

    /* Code constant expressions that were factored out of inner loops.
    */
    if( pParse->pConstExpr ){
      ExprList *pEL = pParse->pConstExpr;
      pParse->okConstFactor = 0;
      for(i=0; i<pEL->nExpr; i++){
        assert( pEL->a[i].u.iConstExprReg>0 );
        sqlite3ExprCode(pParse, pEL->a[i].pExpr, pEL->a[i].u.iConstExprReg);
      }
    }

    if( pParse->bReturning ){
      Returning *pRet = pParse->u1.pReturning;
      if( pRet->nRetCol ){
        sqlite3VdbeAddOp2(v, OP_OpenEphemeral, pRet->iRetCur, pRet->nRetCol);
      }
    }

    /* Finally, jump back to the beginning of the executable code. */
    sqlite3VdbeGoto(v, 1);
  }

  /* Get the VDBE program ready for execution
  */
  assert( v!=0 || pParse->nErr );
  assert( db->mallocFailed==0 || pParse->nErr );
  if( pParse->nErr==0 ){
    /* A minimum of one cursor is required if autoincrement is used
    *  See ticket [a696379c1f08866] */
    assert( pParse->pAinc==0 || pParse->nTab>0 );
    sqlite3VdbeMakeReady(v, pParse);
    pParse->rc = SQLITE_DONE;
  }else{
    pParse->rc = SQLITE_ERROR;
  }
}